

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

UdpInputPortDeclSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::UdpInputPortDeclSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>const&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *args_2)

{
  Token keyword;
  UdpInputPortDeclSyntax *this_00;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *args_local_2;
  Token *args_local_1;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_local;
  BumpAllocator *this_local;
  
  this_00 = (UdpInputPortDeclSyntax *)allocate(this,0x80,8);
  keyword.kind = args_1->kind;
  keyword._2_1_ = args_1->field_0x2;
  keyword.numFlags.raw = (args_1->numFlags).raw;
  keyword.rawLen = args_1->rawLen;
  keyword.info = args_1->info;
  slang::syntax::UdpInputPortDeclSyntax::UdpInputPortDeclSyntax(this_00,args,keyword,args_2);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }